

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createAndAddBlockItems
          (Scope *scope,SyntaxList<slang::syntax::SyntaxNode> *items)

{
  SyntaxKind SVar1;
  size_t sVar2;
  PortDeclarationSyntax *syntax;
  SyntaxNode *syntax_00;
  pointer ppFVar3;
  pointer ppSVar4;
  int iVar5;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  __extent_storage<18446744073709551615UL> extraout_RDX_05;
  pointer ppSVar6;
  long lVar7;
  long lVar8;
  pointer ppSVar9;
  SourceRange sourceRange;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar10;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> args;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> buffer;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_f0 [2];
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> local_b0;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  src = (EVP_PKEY_CTX *)
        local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  sVar2 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ = (pointer)src;
  if (sVar2 != 0) {
    ppSVar6 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_ptr;
    ppSVar9 = ppSVar6 + sVar2;
    do {
      syntax = (PortDeclarationSyntax *)*ppSVar6;
      SVar1 = (syntax->super_MemberSyntax).super_SyntaxNode.kind;
      if ((int)SVar1 < 0x15b) {
        if (0x10b < (int)SVar1) {
          if ((SVar1 != LetDeclaration) && (SVar1 != NetTypeDeclaration)) goto LAB_0089b0c4;
          goto LAB_0089b0ea;
        }
        if ((SVar1 == DataDeclaration) || (SVar1 == ForwardTypedefDeclaration)) goto LAB_0089b0ea;
LAB_0089b0c4:
        findBlocks(scope,(StatementSyntax *)syntax,local_70,&local_b0,false);
        src = extraout_RDX;
      }
      else {
        if ((int)SVar1 < 0x16f) {
          if ((SVar1 != PackageImportDeclaration) && (SVar1 != ParameterDeclarationStatement))
          goto LAB_0089b0c4;
        }
        else {
          if (SVar1 == PortDeclaration) {
            syntax_00 = (syntax->super_MemberSyntax).super_SyntaxNode.previewNode;
            if (syntax_00 != (SyntaxNode *)0x0) {
              Scope::addMembers(scope,syntax_00);
            }
            if (scope->thisSym->kind == Subroutine) {
              local_f0[0].len = 0;
              local_f0[0].cap = 5;
              local_f0[0].data_ = (pointer)local_f0[0].firstElement;
              FormalArgumentSymbol::fromSyntax(scope,syntax,local_f0);
              ppFVar3 = local_f0[0].data_;
              src = extraout_RDX_01;
              if (local_f0[0].len != 0) {
                lVar8 = local_f0[0].len << 3;
                lVar7 = 0;
                do {
                  Scope::insertMember(scope,*(Symbol **)((long)ppFVar3 + lVar7),scope->lastMember,
                                      false,true);
                  lVar7 = lVar7 + 8;
                  src = extraout_RDX_02;
                } while (lVar8 != lVar7);
              }
              if (local_f0[0].data_ != (pointer)local_f0[0].firstElement) {
                operator_delete(local_f0[0].data_);
                src = extraout_RDX_03;
              }
            }
            else {
              sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
              Scope::addDiag(scope,(DiagCode)0x4f0008,sourceRange);
              src = extraout_RDX_04;
            }
            goto LAB_0089b0f5;
          }
          if (SVar1 != TypedefDeclaration) goto LAB_0089b0c4;
        }
LAB_0089b0ea:
        Scope::addMembers(scope,(SyntaxNode *)syntax);
        src = extraout_RDX_00;
      }
LAB_0089b0f5:
      ppSVar6 = ppSVar6 + 1;
    } while (ppSVar6 != ppSVar9);
  }
  iVar5 = SmallVectorBase<const_slang::ast::StatementBlockSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)scope->compilation,src);
  sVar10._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
  if (extraout_RDX_05._M_extent_value != 0) {
    lVar7 = 0;
    do {
      Scope::insertMember(scope,*(Symbol **)((long)sVar10._M_ptr + lVar7),scope->lastMember,false,
                          true);
      lVar7 = lVar7 + 8;
    } while (extraout_RDX_05._M_extent_value * 8 - lVar7 != 0);
  }
  ppSVar4 = local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_;
  if (local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len != 0) {
    lVar8 = local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len << 3;
    lVar7 = 0;
    do {
      Scope::addMembers(scope,*(SyntaxNode **)((long)ppSVar4 + lVar7));
      lVar7 = lVar7 + 8;
    } while (lVar8 != lVar7);
  }
  if (local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ !=
      (pointer)local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement) {
    operator_delete(local_b0.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_);
  }
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  sVar10._M_extent._M_extent_value = extraout_RDX_05._M_extent_value;
  return sVar10;
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createAndAddBlockItems(
    Scope& scope, const SyntaxList<SyntaxNode>& items) {

    SmallVector<const StatementBlockSymbol*> buffer;
    SmallVector<const SyntaxNode*> extraMembers;
    for (auto item : items) {
        switch (item->kind) {
            case SyntaxKind::DataDeclaration:
            case SyntaxKind::TypedefDeclaration:
            case SyntaxKind::ForwardTypedefDeclaration:
            case SyntaxKind::PackageImportDeclaration:
            case SyntaxKind::ParameterDeclarationStatement:
            case SyntaxKind::LetDeclaration:
            case SyntaxKind::NetTypeDeclaration:
                scope.addMembers(*item);
                break;
            case SyntaxKind::PortDeclaration:
                if (item->previewNode)
                    scope.addMembers(*item->previewNode);

                if (scope.asSymbol().kind == SymbolKind::Subroutine) {
                    SmallVector<const FormalArgumentSymbol*> args;
                    FormalArgumentSymbol::fromSyntax(scope, item->as<PortDeclarationSyntax>(),
                                                     args);
                    for (auto arg : args)
                        scope.addMember(*arg);
                }
                else {
                    scope.addDiag(diag::UnexpectedPortDecl, item->sourceRange());
                }
                break;
            default:
                findBlocks(scope, item->as<StatementSyntax>(), buffer, extraMembers, false);
                break;
        }
    }

    auto blocks = buffer.copy(scope.getCompilation());
    for (auto block : blocks)
        scope.addMember(*block);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return blocks;
}